

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O3

float32 helper_vfp_fcvt_f16_to_f32_aarch64(uint32_t a,void *fpstp,uint32_t ahp_mode)

{
  undefined1 uVar1;
  float32 fVar2;
  
  uVar1 = *(undefined1 *)((long)fpstp + 5);
  *(undefined1 *)((long)fpstp + 5) = 0;
  fVar2 = float16_to_float32_aarch64((float16)a,ahp_mode == 0,(float_status *)fpstp);
  *(undefined1 *)((long)fpstp + 5) = uVar1;
  return fVar2;
}

Assistant:

float32 HELPER(vfp_fcvt_f16_to_f32)(uint32_t a, void *fpstp, uint32_t ahp_mode)
{
    /* Squash FZ16 to 0 for the duration of conversion.  In this case,
     * it would affect flushing input denormals.
     */
    float_status *fpst = fpstp;
    flag save = get_flush_inputs_to_zero(fpst);
    set_flush_inputs_to_zero(false, fpst);
    float32 r = float16_to_float32(a, !ahp_mode, fpst);
    set_flush_inputs_to_zero(save, fpst);
    return r;
}